

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int evfilt_timer_knote_create(filter *filt,knote *kn)

{
  unsigned_short *puVar1;
  uint flags;
  int __ufd;
  int iVar2;
  undefined1 local_5c [12];
  itimerspec ts;
  
  puVar1 = &(kn->kev).flags;
  *(byte *)puVar1 = (byte)*puVar1 | 0x20;
  __ufd = timerfd_create(1,0x80000);
  if (-1 < __ufd) {
    flags = (kn->kev).fflags;
    convert_timedata_to_itimerspec(&ts,(kn->kev).data,flags,(kn->kev).flags & 0x10);
    iVar2 = timerfd_settime(__ufd,flags >> 3 & 1,(itimerspec *)&ts,(itimerspec *)0x0);
    if (-1 < iVar2) {
      local_5c._0_4_ = (uint)(((kn->kev).flags & 0x90) != 0) << 0x1e | 0x80000001;
      local_5c._4_8_ = &kn->kn_udata;
      (kn->kn_udata).field_0.ud_kn = kn;
      (kn->kn_udata).ud_type = EPOLL_UDATA_KNOTE;
      iVar2 = epoll_ctl(filt->kf_kqueue->epollfd,1,__ufd,(epoll_event *)local_5c);
      if (-1 < iVar2) {
        (kn->field_10).kn_timerfd = __ufd;
        return 0;
      }
    }
    close(__ufd);
  }
  return -1;
}

Assistant:

int
evfilt_timer_knote_create(struct filter *filt, struct knote *kn)
{
    struct itimerspec ts;
    int tfd;
    int flags;
    int events;

    kn->kev.flags |= EV_CLEAR;

    tfd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);
    if (tfd < 0) {
        if ((errno == EMFILE) || (errno == ENFILE)) {
            dbg_perror("timerfd_create(2) fd_used=%u fd_max=%u", get_fd_used(), get_fd_limit());
        } else {
            dbg_perror("timerfd_create(2)");
        }
        return (-1);
    }
    dbg_printf("timer_fd=%i - created", tfd);

    convert_timedata_to_itimerspec(&ts, kn->kev.data, kn->kev.fflags,
                                   kn->kev.flags & EV_ONESHOT);
    flags = (kn->kev.fflags & NOTE_ABSOLUTE) ? TFD_TIMER_ABSTIME : 0;
    if (timerfd_settime(tfd, flags, &ts, NULL) < 0) {
        dbg_printf("timerfd_settime(2): %s", strerror(errno));
        close(tfd);
        return (-1);
    }

    events = EPOLLIN | EPOLLET;
    if (kn->kev.flags & (EV_ONESHOT | EV_DISPATCH))
        events |= EPOLLONESHOT;

    KN_UDATA(kn);   /* populate this knote's kn_udata field */
    if (epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_ADD, tfd, EPOLL_EV_KN(events, kn)) < 0) {
        dbg_printf("epoll_ctl(2): %d", errno);
        close(tfd);
        return (-1);
    }

    kn->kn_timerfd = tfd;
    return (0);
}